

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

void initialise_ecurve(ec_curve *curve,mp_int *p,mp_int *d,mp_int *a,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order,uint log2_cofactor)

{
  EdwardsCurve *ec;
  EdwardsPoint *pEVar1;
  mp_int *pmVar2;
  
  initialise_common(curve,EC_EDWARDS,p,1);
  ec = ecc_edwards_curve(p,d,a,nonsquare);
  (curve->field_6).e.ec = ec;
  (curve->field_6).e.log2_cofactor = log2_cofactor;
  pEVar1 = ecc_edwards_point_new(ec,G_x,G_y);
  (curve->field_6).e.G = pEVar1;
  pmVar2 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar2;
  return;
}

Assistant:

static void initialise_ecurve(
    struct ec_curve *curve, mp_int *p, mp_int *d, mp_int *a,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order,
    unsigned log2_cofactor)
{
    /* Ensure curve->fieldBytes is long enough to store an extra bit
     * for a compressed point */
    initialise_common(curve, EC_EDWARDS, p, 1);

    curve->e.ec = ecc_edwards_curve(p, d, a, nonsquare);
    curve->e.log2_cofactor = log2_cofactor;

    curve->e.G = ecc_edwards_point_new(curve->e.ec, G_x, G_y);
    curve->e.G_order = mp_copy(G_order);
}